

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParserTest.cpp
# Opt level: O0

void __thiscall
ODDLParser::OpenDDLParserTest_normalizeBufferTest_Test::TestBody
          (OpenDDLParserTest_normalizeBufferTest_Test *this)

{
  bool bVar1;
  reference __dest;
  char *message;
  AssertHelper local_a0;
  Message local_98;
  undefined1 local_90 [8];
  AssertionResult gtest_ar;
  size_t newLen;
  size_t local_68;
  size_t len;
  vector<char,_std::allocator<char>_> buffer;
  char token [42];
  OpenDDLParserTest_normalizeBufferTest_Test *this_local;
  
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_1_ = 'l';
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._17_1_ = 'i';
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._18_1_ = 'n';
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._19_1_ = 'e';
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_1_ = ' ';
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._21_1_ = '1';
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._22_1_ = ' ';
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ = '/';
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)&len);
  local_68 = strlen(&buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
  std::vector<char,_std::allocator<char>_>::resize
            ((vector<char,_std::allocator<char>_> *)&len,local_68);
  __dest = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)&len,0);
  memcpy(__dest,&buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,local_68)
  ;
  OpenDDLParser::normalizeBuffer((vector<char,_std::allocator<char>_> *)&len);
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::vector<char,_std::allocator<char>_>::size((vector<char,_std::allocator<char>_> *)&len);
  testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
            ((internal *)local_90,"newLen","len",(unsigned_long *)&gtest_ar.message_,&local_68);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0xf4,message);
    testing::internal::AssertHelper::operator=(&local_a0,&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)&len);
  return;
}

Assistant:

TEST_F(OpenDDLParserTest, normalizeBufferTest) {
    char token[] = {
        "line 1 // comment\n"
        "line 2\n"
        "//comment\n"
        "line 4"
    };
    std::vector<char> buffer;
    const size_t len(strlen(token));
    buffer.resize(len);
    ::memcpy(&buffer[0], token, len);
    OpenDDLParser::normalizeBuffer(buffer);

    size_t newLen = buffer.size();
    EXPECT_LT(newLen, len);
}